

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonCacheInsert(sqlite3_context *ctx,JsonParse *pParse)

{
  Db *pDVar1;
  sqlite3 *db_00;
  sqlite3 *n;
  undefined8 *puVar2;
  _func_void_void_ptr *in_RSI;
  sqlite3_context *in_RDI;
  sqlite3 *db;
  JsonCache *p;
  int in_stack_fffffffffffffffc;
  
  db_00 = (sqlite3 *)sqlite3_get_auxdata(in_RDI,-0x68f72);
  if (db_00 == (sqlite3 *)0x0) {
    n = sqlite3_context_db_handle(in_RDI);
    puVar2 = (undefined8 *)sqlite3DbMallocZero(db_00,(u64)n);
    if (puVar2 == (undefined8 *)0x0) {
      return 7;
    }
    *puVar2 = n;
    sqlite3_set_auxdata((sqlite3_context *)db,in_stack_fffffffffffffffc,in_RDI,in_RSI);
    db_00 = (sqlite3 *)sqlite3_get_auxdata(in_RDI,-0x68f72);
    if (db_00 == (sqlite3 *)0x0) {
      return 7;
    }
  }
  if (3 < *(int *)&db_00->pVdbe) {
    jsonParseFree((JsonParse *)0x23290e);
    pDVar1 = db_00->aDb;
    db_00->aDb = *(Db **)&db_00->nDb;
    db_00->pDfltColl = (CollSeq *)db_00->mutex;
    db_00->mutex = (sqlite3_mutex *)pDVar1;
    *(undefined4 *)&db_00->pVdbe = 3;
  }
  in_RSI[0x33] = (code)0x0;
  *(int *)(in_RSI + 0x24) = *(int *)(in_RSI + 0x24) + 1;
  in_RSI[0x32] = (code)0x1;
  *(_func_void_void_ptr **)(db_00->aLimit + (long)*(int *)&db_00->pVdbe * 2 + -0x1e) = in_RSI;
  *(int *)&db_00->pVdbe = *(int *)&db_00->pVdbe + 1;
  return 0;
}

Assistant:

static int jsonCacheInsert(
  sqlite3_context *ctx,   /* The SQL statement context holding the cache */
  JsonParse *pParse       /* The parse object to be added to the cache */
){
  JsonCache *p;

  assert( pParse->zJson!=0 );
  assert( pParse->bJsonIsRCStr );
  assert( pParse->delta==0 );
  p = sqlite3_get_auxdata(ctx, JSON_CACHE_ID);
  if( p==0 ){
    sqlite3 *db = sqlite3_context_db_handle(ctx);
    p = sqlite3DbMallocZero(db, sizeof(*p));
    if( p==0 ) return SQLITE_NOMEM;
    p->db = db;
    sqlite3_set_auxdata(ctx, JSON_CACHE_ID, p, jsonCacheDeleteGeneric);
    p = sqlite3_get_auxdata(ctx, JSON_CACHE_ID);
    if( p==0 ) return SQLITE_NOMEM;
  }
  if( p->nUsed >= JSON_CACHE_SIZE ){
    jsonParseFree(p->a[0]);
    memmove(p->a, &p->a[1], (JSON_CACHE_SIZE-1)*sizeof(p->a[0]));
    p->nUsed = JSON_CACHE_SIZE-1;
  }
  assert( pParse->nBlobAlloc>0 );
  pParse->eEdit = 0;
  pParse->nJPRef++;
  pParse->bReadOnly = 1;
  p->a[p->nUsed] = pParse;
  p->nUsed++;
  return SQLITE_OK;
}